

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::is2DArrayGatherOffsetsResultValid<tcu::IntLookupPrecision,int>
               (Texture2DArrayView *texture,Sampler *sampler,IntLookupPrecision *prec,Vec3 *coord,
               int componentNdx,IVec2 (*offsets) [4],Vector<int,_4> *result)

{
  bool bVar1;
  int iVar2;
  int numCoordBits;
  ConstPixelBufferAccess *level;
  float fVar3;
  Vector<float,_3> local_54;
  int layer;
  IVec2 layerRange;
  IVec2 (*offsets_local) [4];
  int componentNdx_local;
  Vec3 *coord_local;
  IntLookupPrecision *prec_local;
  Sampler *sampler_local;
  Texture2DArrayView *texture_local;
  
  layerRange.m_data = (int  [2])offsets;
  iVar2 = Texture2DArrayView::getNumLayers(texture);
  numCoordBits = Vector<int,_3>::z(&prec->coordBits);
  fVar3 = Vector<float,_3>::z(coord);
  computeLayerRange((tcu *)&stack0xffffffffffffffb8,iVar2,numCoordBits,fVar3);
  local_54.m_data[2] = (float)Vector<int,_2>::x((Vector<int,_2> *)&stack0xffffffffffffffb8);
  while( true ) {
    fVar3 = local_54.m_data[2];
    iVar2 = Vector<int,_2>::y((Vector<int,_2> *)&stack0xffffffffffffffb8);
    if (iVar2 < (int)fVar3) {
      return false;
    }
    level = Texture2DArrayView::getLevel(texture,0);
    Vector<float,_3>::swizzle(&local_54,(int)coord,0);
    bVar1 = isGatherOffsetsResultValid<tcu::IntLookupPrecision,int>
                      (level,sampler,prec,(Vec2 *)&local_54,(int)local_54.m_data[2],componentNdx,
                       (IVec2 (*) [4])layerRange.m_data,result);
    if (bVar1) break;
    local_54.m_data[2] = (float)((int)local_54.m_data[2] + 1);
  }
  return true;
}

Assistant:

static bool is2DArrayGatherOffsetsResultValid (const Texture2DArrayView&		texture,
											   const Sampler&					sampler,
											   const PrecType&					prec,
											   const Vec3&						coord,
											   int								componentNdx,
											   const IVec2						(&offsets)[4],
											   const Vector<ScalarType, 4>&		result)
{
	const IVec2 layerRange = computeLayerRange(texture.getNumLayers(), prec.coordBits.z(), coord.z());
	for (int layer = layerRange.x(); layer <= layerRange.y(); layer++)
	{
		if (isGatherOffsetsResultValid(texture.getLevel(0), sampler, prec, coord.swizzle(0,1), layer, componentNdx, offsets, result))
			return true;
	}
	return false;
}